

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_codebook_task_etc(dxt_hc *this,uint64 data,void *param_2)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  uint i_00;
  byte bVar4;
  uchar uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  color_cluster *this_00;
  uint *puVar13;
  float *pfVar14;
  uchar *puVar15;
  unsigned_long_long *puVar16;
  float fVar17;
  bool local_2b5;
  color_quad_u8 *local_290;
  byte local_232;
  byte local_231;
  uint error;
  uint8 s;
  uint uStack_22c;
  uint8 s_best;
  uint error_best;
  uint p;
  uint32 selector;
  uint weight;
  color_quad_u8 *pixels;
  uint local_210;
  uint b;
  uint i;
  uint blockSize;
  vector<unsigned_int> *blocks;
  int local_1f8;
  float endpoint_weight;
  int t;
  uint8 q;
  uint8 c_1;
  uint8 d1;
  uint8 d0;
  int c;
  color_quad_u8 endpoint;
  vector<unsigned_char> selectors;
  results results;
  undefined1 local_1a0 [8];
  params params;
  etc1_optimizer optimizer;
  color_cluster *cluster;
  uint iEnd;
  uint iCluster;
  int refine [4];
  int scan [3];
  uint8 delta [8] [2];
  uint num_tasks;
  void *param_2_local;
  uint64 data_local;
  dxt_hc *this_local;
  
  uVar6 = task_pool::get_num_threads(this->m_pTask_pool);
  stack0xffffffffffffffbc = 0xffffffff;
  _iEnd = 0xfffffffefffffffd;
  refine[0] = 2;
  refine[1] = 3;
  uVar7 = vector<crnlib::dxt_hc::color_cluster>::size(&this->m_color_clusters);
  uVar8 = vector<crnlib::dxt_hc::color_cluster>::size(&this->m_color_clusters);
  for (cluster._4_4_ = (uint)((uVar7 * data) / (ulong)(uVar6 + 1));
      cluster._4_4_ < (uint)(((ulong)uVar8 * (data + 1)) / (ulong)(uVar6 + 1));
      cluster._4_4_ = cluster._4_4_ + 1) {
    this_00 = vector<crnlib::dxt_hc::color_cluster>::operator[]
                        (&this->m_color_clusters,cluster._4_4_);
    uVar7 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&this_00->pixels);
    if (uVar7 != 0) {
      etc1_optimizer::etc1_optimizer((etc1_optimizer *)&params.m_constrain_against_base_color5);
      etc1_optimizer::params::params((params *)local_1a0);
      params.m_pSrc_pixels._0_1_ = 0;
      params.m_scan_delta_size._0_1_ = 0;
      etc1_optimizer::results::results((results *)&selectors.m_size);
      uVar7 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&this_00->pixels);
      vector<unsigned_char>::vector((vector<unsigned_char> *)&c,uVar7);
      params._8_8_ = vector<crnlib::color_quad<unsigned_char,_int>_>::get_ptr(&this_00->pixels);
      results._16_8_ = vector<unsigned_char>::get_ptr((vector<unsigned_char> *)&c);
      results.m_block_color_unscaled.field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           vector<crnlib::color_quad<unsigned_char,_int>_>::size(&this_00->pixels);
      params.super_crn_etc1_pack_params.m_quality =
           (crn_etc_quality)results.m_block_color_unscaled.field_0;
      etc1_optimizer::init
                ((etc1_optimizer *)&params.m_constrain_against_base_color5,(EVP_PKEY_CTX *)local_1a0
                );
      params._24_8_ = refine + 3;
      params.m_pScan_deltas._0_4_ = 3;
      etc1_optimizer::compute((etc1_optimizer *)&params.m_constrain_against_base_color5);
      if ((ulong)(params.super_crn_etc1_pack_params.m_quality * 0x177) < (ulong)selectors._8_8_) {
        params._24_8_ = &iEnd;
        params.m_pScan_deltas._0_4_ = 4;
        etc1_optimizer::compute((etc1_optimizer *)&params.m_constrain_against_base_color5);
      }
      color_quad<unsigned_char,_int>::color_quad((color_quad<unsigned_char,_int> *)&q);
      for (t = 0; t < 3; t = t + 1) {
        (&q)[t] = *(char *)((long)&results.m_error + (long)t) << 3 |
                  (byte)((int)(uint)*(byte *)((long)&results.m_error + (long)t) >> 2);
      }
      bVar4 = (byte)results.m_error._4_4_;
      d0 = bVar4;
      this_00->first_endpoint = (uint)_q;
      bVar2 = delta[(ulong)bVar4 - 4][0];
      bVar4 = delta[(ulong)bVar4 - 4][1];
      for (endpoint_weight._1_1_ = 0; endpoint_weight._1_1_ < 3;
          endpoint_weight._1_1_ = endpoint_weight._1_1_ + 1) {
        bVar3 = (&q)[endpoint_weight._1_1_];
        if (bVar4 < bVar3) {
          uVar5 = bVar3 - bVar4;
        }
        else {
          uVar5 = '\0';
        }
        this_00->color_values[0].field_0.c[endpoint_weight._1_1_] = uVar5;
        if (bVar2 < bVar3) {
          uVar5 = bVar3 - bVar2;
        }
        else {
          uVar5 = '\0';
        }
        this_00->color_values[1].field_0.c[endpoint_weight._1_1_] = uVar5;
        if ((int)(uint)bVar3 < (int)(0xff - (uint)bVar2)) {
          uVar5 = bVar3 + bVar2;
        }
        else {
          uVar5 = 0xff;
        }
        this_00->color_values[2].field_0.c[endpoint_weight._1_1_] = uVar5;
        if ((int)(uint)bVar3 < (int)(0xff - (uint)bVar4)) {
          uVar5 = bVar3 + bVar4;
        }
        else {
          uVar5 = 0xff;
        }
        this_00->color_values[3].field_0.c[endpoint_weight._1_1_] = uVar5;
      }
      for (local_1f8 = 0; local_1f8 < 4; local_1f8 = local_1f8 + 1) {
        this_00->color_values[local_1f8].field_0.field_0.a = 0xff;
      }
      iVar9 = color_quad<unsigned_char,_int>::get_luma(this_00->color_values + 3);
      iVar10 = color_quad<unsigned_char,_int>::get_luma(this_00->color_values);
      fVar17 = math::minimum<float>((float)(iVar9 - iVar10) / 100.0,1.0);
      fVar17 = powf(fVar17,2.7);
      uVar11 = 0x10;
      if ((this->m_has_subblocks & 1U) != 0) {
        uVar11 = 8;
      }
      for (local_210 = 0; uVar7 = vector<unsigned_int>::size(this_00->blocks), local_210 < uVar7;
          local_210 = local_210 + 1) {
        puVar13 = vector<unsigned_int>::operator[](this_00->blocks,local_210);
        i_00 = *puVar13;
        if ((this->m_has_subblocks & 1U) == 0) {
          local_290 = this->m_blocks[i_00];
        }
        else {
          local_290 = *this->m_blocks + (ulong)i_00 * 8;
        }
        pfVar14 = vector<float>::operator[](&this->m_block_weights,i_00);
        fVar1 = *pfVar14;
        puVar15 = vector<unsigned_char>::operator[](&this->m_block_encodings,i_00);
        uVar12 = math::clamp<unsigned_int>
                           ((uint)(long)(fVar17 * 32768.0 * fVar1 *
                                        *(float *)(&DAT_0022fcd0 + (ulong)(*puVar15 != '\0') * 4)),1
                            ,0xffff);
        error_best = 0;
        for (uStack_22c = 0; uStack_22c < uVar11; uStack_22c = uStack_22c + 1) {
          error = 0xffffffff;
          local_231 = 0;
          for (local_232 = 0; local_232 < 4; local_232 = local_232 + 1) {
            uVar7 = crnlib::color::color_distance
                              ((bool)((this->m_params).m_perceptual & 1),local_290 + uStack_22c,
                               this_00->color_values + local_232,false);
            if (uVar7 < error) {
              local_231 = local_232;
              error = uVar7;
            }
          }
          error_best = error_best << 2 | (uint)local_231;
        }
        local_2b5 = (this->m_has_subblocks & 1U) == 0 || (i_00 & 1) != 0;
        puVar16 = vector<unsigned_long_long>::operator[](this->m_block_selectors,i_00);
        *puVar16 = (ulong)error_best << ((~local_2b5 & 1U) << 4 | 0x20) | (ulong)uVar12;
      }
      vector<unsigned_char>::~vector((vector<unsigned_char> *)&c);
      etc1_optimizer::~etc1_optimizer((etc1_optimizer *)&params.m_constrain_against_base_color5);
    }
  }
  return;
}

Assistant:

void dxt_hc::determine_color_endpoint_codebook_task_etc(uint64 data, void*)
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint8 delta[8][2] = { { 2, 8 }, { 5, 17 }, { 9, 29 }, { 13, 42 }, { 18, 60 }, { 24, 80 }, { 33, 106 }, { 47, 183 } };
        int scan[] = { -1, 0, 1 };
        int refine[] = { -3, -2, 2, 3 };
        for (uint iCluster = m_color_clusters.size() * data / num_tasks, iEnd = m_color_clusters.size() * (data + 1) / num_tasks; iCluster < iEnd; iCluster++)
        {
            color_cluster& cluster = m_color_clusters[iCluster];
            if (cluster.pixels.size())
            {
                etc1_optimizer optimizer;
                etc1_optimizer::params params;
                params.m_use_color4 = false;
                params.m_constrain_against_base_color5 = false;
                etc1_optimizer::results results;
                crnlib::vector<uint8> selectors(cluster.pixels.size());
                params.m_pSrc_pixels = cluster.pixels.get_ptr();
                results.m_pSelectors = selectors.get_ptr();
                results.m_n = params.m_num_src_pixels = cluster.pixels.size();
                optimizer.init(params, results);
                params.m_pScan_deltas = scan;
                params.m_scan_delta_size = sizeof(scan) / sizeof(*scan);
                optimizer.compute();
                if (results.m_error > 375 * params.m_num_src_pixels)
                {
                    params.m_pScan_deltas = refine;
                    params.m_scan_delta_size = sizeof(refine) / sizeof(*refine);
                    optimizer.compute();
                }
                color_quad_u8 endpoint;
                for (int c = 0; c < 3; c++)
                {
                    endpoint.c[c] = results.m_block_color_unscaled.c[c] << 3 | results.m_block_color_unscaled.c[c] >> 2;
                }
                endpoint.c[3] = results.m_block_inten_table;
                cluster.first_endpoint = endpoint.m_u32;
                for (uint8 d0 = delta[endpoint.c[3]][0], d1 = delta[endpoint.c[3]][1], c = 0; c < 3; c++)
                {
                    uint8 q = endpoint.c[c];
                    cluster.color_values[0].c[c] = q <= d1 ? 0 : q - d1;
                    cluster.color_values[1].c[c] = q <= d0 ? 0 : q - d0;
                    cluster.color_values[2].c[c] = q >= 255 - d0 ? 255 : q + d0;
                    cluster.color_values[3].c[c] = q >= 255 - d1 ? 255 : q + d1;
                }
                for (int t = 0; t < 4; t++)
                {
                    cluster.color_values[t].c[3] = 0xFF;
                }
                float endpoint_weight = powf(math::minimum((cluster.color_values[3].get_luma() - cluster.color_values[0].get_luma()) / 100.0f, 1.0f), 2.7f);

                crnlib::vector<uint>& blocks = cluster.blocks[cColor];
                uint blockSize = m_has_subblocks ? 8 : 16;
                for (uint i = 0; i < blocks.size(); i++)
                {
                    uint b = blocks[i];
                    color_quad_u8* pixels = m_has_subblocks ? ((color_quad_u8(*)[8])m_blocks)[b] : m_blocks[b];
                    uint weight = (uint)(math::clamp<uint>(0x8000 * endpoint_weight * m_block_weights[b] * (m_block_encodings[b] ? 0.972f : 1.0f), 1, 0xFFFF));
                    uint32 selector = 0;
                    for (uint p = 0; p < blockSize; p++)
                    {
                        uint error_best = cUINT32_MAX;
                        uint8 s_best = 0;
                        for (uint8 s = 0; s < 4; s++)
                        {
                            uint error = color::color_distance(m_params.m_perceptual, pixels[p], cluster.color_values[s], false);
                            if (error < error_best)
                            {
                                s_best = s;
                                error_best = error;
                            }
                        }
                        selector = selector << 2 | s_best;
                    }
                    m_block_selectors[cColor][b] = (uint64)selector << (!m_has_subblocks || (b & 1) ? 32 : 48) | weight;
                }
            }
        }
    }